

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  Mat *pMVar1;
  Mat *pMVar2;
  undefined4 uVar3;
  int *piVar4;
  void *pvVar5;
  Allocator *pAVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar21 [16];
  Mat local_78;
  
  if (this->dynamic_weight != 0) {
    return 0;
  }
  (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->weight_data_size,0);
  pMVar1 = &this->weight_data;
  if (pMVar1 != &local_78) {
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->weight_data).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar5 = (this->weight_data).data;
        pAVar6 = (this->weight_data).allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data).cstep = 0;
    *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->weight_data).refcount = (int *)0x0;
    (this->weight_data).dims = 0;
    (this->weight_data).w = 0;
    (this->weight_data).h = 0;
    (this->weight_data).d = 0;
    (this->weight_data).c = 0;
    (this->weight_data).data = local_78.data;
    (this->weight_data).refcount = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    (this->weight_data).elemsize = local_78.elemsize;
    (this->weight_data).elempack = local_78.elempack;
    (this->weight_data).allocator = local_78.allocator;
    (this->weight_data).dims = local_78.dims;
    (this->weight_data).w = local_78.w;
    (this->weight_data).h = local_78.h;
    (this->weight_data).d = local_78.d;
    (this->weight_data).c = local_78.c;
    (this->weight_data).cstep = local_78.cstep;
  }
  piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (pMVar1->data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->weight_data).c * (this->weight_data).cstep == 0) {
    return -100;
  }
  if (this->bias_term != 0) {
    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->num_output,1);
    pMVar1 = &this->bias_data;
    if (pMVar1 != &local_78) {
      piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (this->bias_data).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = (this->bias_data).data;
          pAVar6 = (this->bias_data).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar6->_vptr_Allocator[3])();
          }
        }
      }
      (this->bias_data).cstep = 0;
      *(undefined1 (*) [16])((long)&(this->bias_data).refcount + 4) = (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->bias_data).dims = 0;
      (this->bias_data).w = 0;
      (this->bias_data).h = 0;
      (this->bias_data).d = 0;
      (this->bias_data).c = 0;
      (this->bias_data).data = local_78.data;
      (this->bias_data).refcount = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      (this->bias_data).elemsize = local_78.elemsize;
      (this->bias_data).elempack = local_78.elempack;
      (this->bias_data).allocator = local_78.allocator;
      (this->bias_data).dims = local_78.dims;
      (this->bias_data).w = local_78.w;
      (this->bias_data).h = local_78.h;
      (this->bias_data).d = local_78.d;
      (this->bias_data).c = local_78.c;
      (this->bias_data).cstep = local_78.cstep;
    }
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (pMVar1->data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  iVar16 = this->int8_scale_term;
  if (iVar16 < 0x65) {
    if (iVar16 == 1) {
LAB_00272dad:
      (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->group,1);
      pMVar1 = &this->weight_data_int8_scales;
      if (pMVar1 != &local_78) {
        piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (this->weight_data_int8_scales).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = (this->weight_data_int8_scales).data;
            pAVar6 = (this->weight_data_int8_scales).allocator;
            if (pAVar6 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar6->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_int8_scales).cstep = 0;
        *(undefined1 (*) [16])((long)&(this->weight_data_int8_scales).refcount + 4) =
             (undefined1  [16])0x0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->weight_data_int8_scales).dims = 0;
        (this->weight_data_int8_scales).w = 0;
        (this->weight_data_int8_scales).h = 0;
        (this->weight_data_int8_scales).d = 0;
        (this->weight_data_int8_scales).c = 0;
        (this->weight_data_int8_scales).data = local_78.data;
        (this->weight_data_int8_scales).refcount =
             (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        (this->weight_data_int8_scales).elemsize = local_78.elemsize;
        (this->weight_data_int8_scales).elempack = local_78.elempack;
        (this->weight_data_int8_scales).allocator = local_78.allocator;
        (this->weight_data_int8_scales).dims = local_78.dims;
        (this->weight_data_int8_scales).w = local_78.w;
        (this->weight_data_int8_scales).h = local_78.h;
        (this->weight_data_int8_scales).d = local_78.d;
        (this->weight_data_int8_scales).c = local_78.c;
        (this->weight_data_int8_scales).cstep = local_78.cstep;
      }
      piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      (*mb->_vptr_ModelBin[2])(&local_78,mb,1);
      pMVar1 = &this->bottom_blob_int8_scales;
      if (pMVar1 != &local_78) {
        piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (this->bottom_blob_int8_scales).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = (this->bottom_blob_int8_scales).data;
            pAVar6 = (this->bottom_blob_int8_scales).allocator;
            if (pAVar6 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar6->_vptr_Allocator[3])();
            }
          }
        }
        (this->bottom_blob_int8_scales).cstep = 0;
        *(undefined1 (*) [16])((long)&(this->bottom_blob_int8_scales).refcount + 4) =
             (undefined1  [16])0x0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->bottom_blob_int8_scales).dims = 0;
        (this->bottom_blob_int8_scales).w = 0;
        (this->bottom_blob_int8_scales).h = 0;
        (this->bottom_blob_int8_scales).d = 0;
        (this->bottom_blob_int8_scales).c = 0;
        (this->bottom_blob_int8_scales).data = local_78.data;
        (this->bottom_blob_int8_scales).refcount =
             (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        (this->bottom_blob_int8_scales).elemsize = local_78.elemsize;
        (this->bottom_blob_int8_scales).elempack = local_78.elempack;
        (this->bottom_blob_int8_scales).allocator = local_78.allocator;
        (this->bottom_blob_int8_scales).dims = local_78.dims;
        (this->bottom_blob_int8_scales).w = local_78.w;
        (this->bottom_blob_int8_scales).h = local_78.h;
        (this->bottom_blob_int8_scales).d = local_78.d;
        (this->bottom_blob_int8_scales).c = local_78.c;
        (this->bottom_blob_int8_scales).cstep = local_78.cstep;
      }
      piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar3 = *(this->bottom_blob_int8_scales).data;
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      Mat::create(&local_78,this->group,4,(Allocator *)0x0);
      if (pMVar1 != &local_78) {
        piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (this->bottom_blob_int8_scales).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = (this->bottom_blob_int8_scales).data;
            pAVar6 = (this->bottom_blob_int8_scales).allocator;
            if (pAVar6 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar6->_vptr_Allocator[3])();
            }
          }
        }
        (this->bottom_blob_int8_scales).cstep = 0;
        *(undefined1 (*) [16])((long)&(this->bottom_blob_int8_scales).refcount + 4) =
             (undefined1  [16])0x0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->bottom_blob_int8_scales).dims = 0;
        (this->bottom_blob_int8_scales).w = 0;
        (this->bottom_blob_int8_scales).h = 0;
        (this->bottom_blob_int8_scales).d = 0;
        (this->bottom_blob_int8_scales).c = 0;
        (this->bottom_blob_int8_scales).data = local_78.data;
        (this->bottom_blob_int8_scales).refcount =
             (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        (this->bottom_blob_int8_scales).elemsize = local_78.elemsize;
        (this->bottom_blob_int8_scales).elempack = local_78.elempack;
        (this->bottom_blob_int8_scales).allocator = local_78.allocator;
        (this->bottom_blob_int8_scales).dims = local_78.dims;
        (this->bottom_blob_int8_scales).w = local_78.w;
        (this->bottom_blob_int8_scales).h = local_78.h;
        (this->bottom_blob_int8_scales).d = local_78.d;
        (this->bottom_blob_int8_scales).c = local_78.c;
        (this->bottom_blob_int8_scales).cstep = local_78.cstep;
      }
      piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      auVar9 = _DAT_00316360;
      auVar8 = _DAT_00316350;
      auVar7 = _DAT_003162e0;
      uVar10 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
      if (0 < (int)uVar10) {
        pvVar5 = pMVar1->data;
        lVar11 = (ulong)uVar10 - 1;
        auVar21._8_4_ = (int)lVar11;
        auVar21._0_8_ = lVar11;
        auVar21._12_4_ = (int)((ulong)lVar11 >> 0x20);
        uVar12 = 0;
        auVar21 = auVar21 ^ _DAT_003162e0;
        do {
          auVar17._8_4_ = (int)uVar12;
          auVar17._0_8_ = uVar12;
          auVar17._12_4_ = (int)(uVar12 >> 0x20);
          auVar13 = (auVar17 | auVar9) ^ auVar7;
          iVar16 = auVar21._4_4_;
          if ((bool)(~(auVar13._4_4_ == iVar16 && auVar21._0_4_ < auVar13._0_4_ ||
                      iVar16 < auVar13._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar5 + uVar12 * 4) = uVar3;
          }
          if ((auVar13._12_4_ != auVar21._12_4_ || auVar13._8_4_ <= auVar21._8_4_) &&
              auVar13._12_4_ <= auVar21._12_4_) {
            *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 4) = uVar3;
          }
          auVar17 = (auVar17 | auVar8) ^ auVar7;
          iVar22 = auVar17._4_4_;
          if (iVar22 <= iVar16 && (iVar22 != iVar16 || auVar17._0_4_ <= auVar21._0_4_)) {
            *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 8) = uVar3;
            *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 0xc) = uVar3;
          }
          uVar12 = uVar12 + 4;
        } while ((uVar10 + 3 & 0xfffffffc) != uVar12);
      }
      goto LAB_002739c4;
    }
    if (iVar16 != 2) goto LAB_002739c4;
  }
  else if (iVar16 != 0x66) {
    if (iVar16 != 0x65) goto LAB_002739c4;
    goto LAB_00272dad;
  }
  (*mb->_vptr_ModelBin[2])(&local_78,mb,1,1);
  pMVar1 = &this->weight_data_int8_scales;
  if (pMVar1 != &local_78) {
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->weight_data_int8_scales).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar5 = (this->weight_data_int8_scales).data;
        pAVar6 = (this->weight_data_int8_scales).allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data_int8_scales).cstep = 0;
    *(undefined1 (*) [16])((long)&(this->weight_data_int8_scales).refcount + 4) =
         (undefined1  [16])0x0;
    pMVar1->data = (void *)0x0;
    pMVar1->refcount = (int *)0x0;
    (this->weight_data_int8_scales).dims = 0;
    (this->weight_data_int8_scales).w = 0;
    (this->weight_data_int8_scales).h = 0;
    (this->weight_data_int8_scales).d = 0;
    (this->weight_data_int8_scales).c = 0;
    (this->weight_data_int8_scales).data = local_78.data;
    (this->weight_data_int8_scales).refcount =
         (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    (this->weight_data_int8_scales).elemsize = local_78.elemsize;
    (this->weight_data_int8_scales).elempack = local_78.elempack;
    (this->weight_data_int8_scales).allocator = local_78.allocator;
    (this->weight_data_int8_scales).dims = local_78.dims;
    (this->weight_data_int8_scales).w = local_78.w;
    (this->weight_data_int8_scales).h = local_78.h;
    (this->weight_data_int8_scales).d = local_78.d;
    (this->weight_data_int8_scales).c = local_78.c;
    (this->weight_data_int8_scales).cstep = local_78.cstep;
  }
  piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  (*mb->_vptr_ModelBin[2])(&local_78,mb,1);
  pMVar2 = &this->bottom_blob_int8_scales;
  if (pMVar2 != &local_78) {
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->bottom_blob_int8_scales).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar5 = (this->bottom_blob_int8_scales).data;
        pAVar6 = (this->bottom_blob_int8_scales).allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->bottom_blob_int8_scales).cstep = 0;
    *(undefined1 (*) [16])((long)&(this->bottom_blob_int8_scales).refcount + 4) =
         (undefined1  [16])0x0;
    pMVar2->data = (void *)0x0;
    pMVar2->refcount = (int *)0x0;
    (this->bottom_blob_int8_scales).dims = 0;
    (this->bottom_blob_int8_scales).w = 0;
    (this->bottom_blob_int8_scales).h = 0;
    (this->bottom_blob_int8_scales).d = 0;
    (this->bottom_blob_int8_scales).c = 0;
    (this->bottom_blob_int8_scales).data = local_78.data;
    (this->bottom_blob_int8_scales).refcount =
         (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    (this->bottom_blob_int8_scales).elemsize = local_78.elemsize;
    (this->bottom_blob_int8_scales).elempack = local_78.elempack;
    (this->bottom_blob_int8_scales).allocator = local_78.allocator;
    (this->bottom_blob_int8_scales).dims = local_78.dims;
    (this->bottom_blob_int8_scales).w = local_78.w;
    (this->bottom_blob_int8_scales).h = local_78.h;
    (this->bottom_blob_int8_scales).d = local_78.d;
    (this->bottom_blob_int8_scales).c = local_78.c;
    (this->bottom_blob_int8_scales).cstep = local_78.cstep;
  }
  piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  uVar3 = *(this->weight_data_int8_scales).data;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,this->group,4,(Allocator *)0x0);
  if (pMVar1 != &local_78) {
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->weight_data_int8_scales).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar5 = (this->weight_data_int8_scales).data;
        pAVar6 = (this->weight_data_int8_scales).allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data_int8_scales).cstep = 0;
    *(undefined1 (*) [16])((long)&(this->weight_data_int8_scales).refcount + 4) =
         (undefined1  [16])0x0;
    pMVar1->data = (void *)0x0;
    pMVar1->refcount = (int *)0x0;
    (this->weight_data_int8_scales).dims = 0;
    (this->weight_data_int8_scales).w = 0;
    (this->weight_data_int8_scales).h = 0;
    (this->weight_data_int8_scales).d = 0;
    (this->weight_data_int8_scales).c = 0;
    (this->weight_data_int8_scales).data = local_78.data;
    (this->weight_data_int8_scales).refcount =
         (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    (this->weight_data_int8_scales).elemsize = local_78.elemsize;
    (this->weight_data_int8_scales).elempack = local_78.elempack;
    (this->weight_data_int8_scales).allocator = local_78.allocator;
    (this->weight_data_int8_scales).dims = local_78.dims;
    (this->weight_data_int8_scales).w = local_78.w;
    (this->weight_data_int8_scales).h = local_78.h;
    (this->weight_data_int8_scales).d = local_78.d;
    (this->weight_data_int8_scales).c = local_78.c;
    (this->weight_data_int8_scales).cstep = local_78.cstep;
  }
  piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  auVar9 = _DAT_00316360;
  auVar8 = _DAT_00316350;
  auVar7 = _DAT_003162e0;
  uVar10 = (this->weight_data_int8_scales).c * (int)(this->weight_data_int8_scales).cstep;
  if (0 < (int)uVar10) {
    pvVar5 = pMVar1->data;
    lVar11 = (ulong)uVar10 - 1;
    auVar13._8_4_ = (int)lVar11;
    auVar13._0_8_ = lVar11;
    auVar13._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar12 = 0;
    auVar13 = auVar13 ^ _DAT_003162e0;
    do {
      auVar18._8_4_ = (int)uVar12;
      auVar18._0_8_ = uVar12;
      auVar18._12_4_ = (int)(uVar12 >> 0x20);
      auVar21 = (auVar18 | auVar9) ^ auVar7;
      iVar16 = auVar13._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar16 && auVar13._0_4_ < auVar21._0_4_ ||
                  iVar16 < auVar21._4_4_) & 1)) {
        *(undefined4 *)((long)pvVar5 + uVar12 * 4) = uVar3;
      }
      if ((auVar21._12_4_ != auVar13._12_4_ || auVar21._8_4_ <= auVar13._8_4_) &&
          auVar21._12_4_ <= auVar13._12_4_) {
        *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 4) = uVar3;
      }
      auVar21 = (auVar18 | auVar8) ^ auVar7;
      iVar22 = auVar21._4_4_;
      if (iVar22 <= iVar16 && (iVar22 != iVar16 || auVar21._0_4_ <= auVar13._0_4_)) {
        *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 8) = uVar3;
        *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 0xc) = uVar3;
      }
      uVar12 = uVar12 + 4;
    } while ((uVar10 + 3 & 0xfffffffc) != uVar12);
  }
  uVar3 = *(this->bottom_blob_int8_scales).data;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,this->group,4,(Allocator *)0x0);
  if (pMVar2 != &local_78) {
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->bottom_blob_int8_scales).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar5 = (this->bottom_blob_int8_scales).data;
        pAVar6 = (this->bottom_blob_int8_scales).allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->bottom_blob_int8_scales).cstep = 0;
    *(undefined1 (*) [16])((long)&(this->bottom_blob_int8_scales).refcount + 4) =
         (undefined1  [16])0x0;
    pMVar2->data = (void *)0x0;
    pMVar2->refcount = (int *)0x0;
    (this->bottom_blob_int8_scales).dims = 0;
    (this->bottom_blob_int8_scales).w = 0;
    (this->bottom_blob_int8_scales).h = 0;
    (this->bottom_blob_int8_scales).d = 0;
    (this->bottom_blob_int8_scales).c = 0;
    (this->bottom_blob_int8_scales).data = local_78.data;
    (this->bottom_blob_int8_scales).refcount =
         (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    (this->bottom_blob_int8_scales).elemsize = local_78.elemsize;
    (this->bottom_blob_int8_scales).elempack = local_78.elempack;
    (this->bottom_blob_int8_scales).allocator = local_78.allocator;
    (this->bottom_blob_int8_scales).dims = local_78.dims;
    (this->bottom_blob_int8_scales).w = local_78.w;
    (this->bottom_blob_int8_scales).h = local_78.h;
    (this->bottom_blob_int8_scales).d = local_78.d;
    (this->bottom_blob_int8_scales).c = local_78.c;
    (this->bottom_blob_int8_scales).cstep = local_78.cstep;
  }
  piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  auVar9 = _DAT_00316360;
  auVar8 = _DAT_00316350;
  auVar7 = _DAT_003162e0;
  uVar10 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
  if (0 < (int)uVar10) {
    pvVar5 = pMVar2->data;
    lVar11 = (ulong)uVar10 - 1;
    auVar14._8_4_ = (int)lVar11;
    auVar14._0_8_ = lVar11;
    auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar12 = 0;
    auVar14 = auVar14 ^ _DAT_003162e0;
    do {
      auVar19._8_4_ = (int)uVar12;
      auVar19._0_8_ = uVar12;
      auVar19._12_4_ = (int)(uVar12 >> 0x20);
      auVar21 = (auVar19 | auVar9) ^ auVar7;
      iVar16 = auVar14._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar16 && auVar14._0_4_ < auVar21._0_4_ ||
                  iVar16 < auVar21._4_4_) & 1)) {
        *(undefined4 *)((long)pvVar5 + uVar12 * 4) = uVar3;
      }
      if ((auVar21._12_4_ != auVar14._12_4_ || auVar21._8_4_ <= auVar14._8_4_) &&
          auVar21._12_4_ <= auVar14._12_4_) {
        *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 4) = uVar3;
      }
      auVar21 = (auVar19 | auVar8) ^ auVar7;
      iVar22 = auVar21._4_4_;
      if (iVar22 <= iVar16 && (iVar22 != iVar16 || auVar21._0_4_ <= auVar14._0_4_)) {
        *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 8) = uVar3;
        *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 0xc) = uVar3;
      }
      uVar12 = uVar12 + 4;
    } while ((uVar10 + 3 & 0xfffffffc) != uVar12);
  }
LAB_002739c4:
  if (100 < this->int8_scale_term) {
    (*mb->_vptr_ModelBin[2])(&local_78,mb,1);
    pMVar1 = &this->top_blob_int8_scales;
    if (pMVar1 != &local_78) {
      piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (this->top_blob_int8_scales).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = (this->top_blob_int8_scales).data;
          pAVar6 = (this->top_blob_int8_scales).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar6->_vptr_Allocator[3])();
          }
        }
      }
      (this->top_blob_int8_scales).cstep = 0;
      *(undefined1 (*) [16])((long)&(this->top_blob_int8_scales).refcount + 4) =
           (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->top_blob_int8_scales).dims = 0;
      (this->top_blob_int8_scales).w = 0;
      (this->top_blob_int8_scales).h = 0;
      (this->top_blob_int8_scales).d = 0;
      (this->top_blob_int8_scales).c = 0;
      (this->top_blob_int8_scales).data = local_78.data;
      (this->top_blob_int8_scales).refcount =
           (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      (this->top_blob_int8_scales).elemsize = local_78.elemsize;
      (this->top_blob_int8_scales).elempack = local_78.elempack;
      (this->top_blob_int8_scales).allocator = local_78.allocator;
      (this->top_blob_int8_scales).dims = local_78.dims;
      (this->top_blob_int8_scales).w = local_78.w;
      (this->top_blob_int8_scales).h = local_78.h;
      (this->top_blob_int8_scales).d = local_78.d;
      (this->top_blob_int8_scales).c = local_78.c;
      (this->top_blob_int8_scales).cstep = local_78.cstep;
    }
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar3 = *(this->top_blob_int8_scales).data;
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,this->group,4,(Allocator *)0x0);
    if (pMVar1 != &local_78) {
      piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (this->top_blob_int8_scales).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = (this->top_blob_int8_scales).data;
          pAVar6 = (this->top_blob_int8_scales).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar6->_vptr_Allocator[3])();
          }
        }
      }
      (this->top_blob_int8_scales).cstep = 0;
      *(undefined1 (*) [16])((long)&(this->top_blob_int8_scales).refcount + 4) =
           (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->top_blob_int8_scales).dims = 0;
      (this->top_blob_int8_scales).w = 0;
      (this->top_blob_int8_scales).h = 0;
      (this->top_blob_int8_scales).d = 0;
      (this->top_blob_int8_scales).c = 0;
      (this->top_blob_int8_scales).data = local_78.data;
      (this->top_blob_int8_scales).refcount =
           (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      (this->top_blob_int8_scales).elemsize = local_78.elemsize;
      (this->top_blob_int8_scales).elempack = local_78.elempack;
      (this->top_blob_int8_scales).allocator = local_78.allocator;
      (this->top_blob_int8_scales).dims = local_78.dims;
      (this->top_blob_int8_scales).w = local_78.w;
      (this->top_blob_int8_scales).h = local_78.h;
      (this->top_blob_int8_scales).d = local_78.d;
      (this->top_blob_int8_scales).c = local_78.c;
      (this->top_blob_int8_scales).cstep = local_78.cstep;
    }
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    auVar9 = _DAT_00316360;
    auVar8 = _DAT_00316350;
    auVar7 = _DAT_003162e0;
    uVar10 = (this->top_blob_int8_scales).c * (int)(this->top_blob_int8_scales).cstep;
    if (0 < (int)uVar10) {
      pvVar5 = pMVar1->data;
      lVar11 = (ulong)uVar10 - 1;
      auVar15._8_4_ = (int)lVar11;
      auVar15._0_8_ = lVar11;
      auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar12 = 0;
      auVar15 = auVar15 ^ _DAT_003162e0;
      do {
        auVar20._8_4_ = (int)uVar12;
        auVar20._0_8_ = uVar12;
        auVar20._12_4_ = (int)(uVar12 >> 0x20);
        auVar21 = (auVar20 | auVar9) ^ auVar7;
        iVar16 = auVar15._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar16 && auVar15._0_4_ < auVar21._0_4_ ||
                    iVar16 < auVar21._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar5 + uVar12 * 4) = uVar3;
        }
        if ((auVar21._12_4_ != auVar15._12_4_ || auVar21._8_4_ <= auVar15._8_4_) &&
            auVar21._12_4_ <= auVar15._12_4_) {
          *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 4) = uVar3;
        }
        auVar21 = (auVar20 | auVar8) ^ auVar7;
        iVar22 = auVar21._4_4_;
        if (iVar22 <= iVar16 && (iVar22 != iVar16 || auVar21._0_4_ <= auVar15._0_4_)) {
          *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 8) = uVar3;
          *(undefined4 *)((long)pvVar5 + uVar12 * 4 + 0xc) = uVar3;
        }
        uVar12 = uVar12 + 4;
      } while ((uVar10 + 3 & 0xfffffffc) != uVar12);
      return 0;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term == 1 || int8_scale_term == 101)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2 || int8_scale_term == 102)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);

        float top_blob_int8_scale = top_blob_int8_scales[0];
        top_blob_int8_scales = Mat(group);
        top_blob_int8_scales.fill(top_blob_int8_scale);
    }
#endif // NCNN_INT8

    return 0;
}